

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall dg::pta::PointerAnalysis::enqueue(PointerAnalysis *this,PSNode *n)

{
  PSNode *local_8;
  
  local_8 = n;
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
            (&this->changed,&local_8);
  return;
}

Assistant:

virtual void enqueue(PSNode *n) { changed.push_back(n); }